

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O1

void __thiscall OmegaOP::algoChannel(OmegaOP *this,vector<double,_std::allocator<double>_> *data)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double **ppdVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  OmegaOP *pOVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  Costs cost;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double theV;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  OmegaOP *local_48;
  double *local_40;
  double local_38;
  
  uVar11 = (ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar8 = this->nbStates;
  uVar15 = (ulong)uVar8;
  Costs::Costs(&cost);
  ppdVar4 = preprocessing(this,data);
  this->S12P = ppdVar4;
  uVar16 = (int)uVar11 + 1;
  uVar9 = (ulong)uVar16;
  local_68 = uVar11;
  pvVar5 = operator_new__(uVar9 * 4);
  pvVar6 = operator_new__(uVar9 * 4);
  theV = 0.0;
  local_a0 = 2;
  dVar19 = 0.0;
  local_58 = uVar9;
  if (2 < uVar16) {
    local_88 = (ulong)(uVar8 - 1);
    local_60 = local_88 - 1;
    uVar16 = 0;
    uVar8 = 1;
    local_80 = uVar15;
    local_50 = pvVar5;
    local_48 = this;
    do {
      uVar11 = (ulong)uVar8;
      uVar9 = 0;
      do {
        if (local_88 == uVar9) {
          iVar7 = (int)local_88;
          goto LAB_0010788c;
        }
        lVar12 = uVar9 + 1;
        dVar19 = this->Q[uVar9][uVar11];
        uVar9 = uVar9 + 1;
        pdVar2 = this->Q[lVar12] + uVar11;
      } while (*pdVar2 <= dVar19 && dVar19 != *pdVar2);
      iVar7 = (int)uVar9 + -1;
LAB_0010788c:
      *(int *)((long)pvVar5 + uVar11 * 4) = iVar7;
      uVar18 = uVar15 & 0xffffffff;
      uVar9 = local_60;
      do {
        if (uVar9 == 0xffffffffffffffff) {
          uVar8 = 0;
          break;
        }
        dVar19 = this->Q[uVar9 + 1][uVar11];
        uVar14 = uVar9 & 0xffffffff;
        uVar8 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar8;
        uVar9 = uVar9 - 1;
        pdVar2 = this->Q[uVar14] + uVar11;
      } while (*pdVar2 <= dVar19 && dVar19 != *pdVar2);
      *(uint *)((long)pvVar6 + uVar11 * 4) = uVar8;
      if ((int)uVar15 != 0) {
        uVar11 = 0;
        do {
          local_98 = 1;
          if (local_a0 < 2) {
            local_9c = 0;
            dVar19 = INFINITY;
            uVar8 = 0;
          }
          else {
            uVar15 = 0;
            local_9c = 0;
            dVar19 = INFINITY;
            local_78 = uVar11;
            do {
              if (local_98 < local_a0 - 1) {
                pdVar2 = *this->S12P;
                pdVar3 = this->S12P[2];
                local_90 = dVar19;
                theV = Costs::vhat(&cost,this->states + uVar11,&local_98,&local_a0,pdVar2 + local_98
                                   ,pdVar2 + local_a0,pdVar3 + local_98,pdVar3 + local_a0);
                local_94 = Costs::closestStateIndex(&cost,&theV,this->states,(uint)local_80);
                uVar11 = local_78;
                dVar19 = local_90;
              }
              else {
                local_94 = *(uint *)((long)pvVar5 + (ulong)(local_a0 - 1) * 4);
              }
              uVar9 = (ulong)local_98;
              uVar8 = *(uint *)((long)pvVar5 + uVar9 * 4);
              uVar1 = uVar8;
              if (local_94 < uVar8) {
                uVar1 = local_94;
              }
              uVar10 = *(uint *)((long)pvVar6 + uVar9 * 4);
              if (uVar10 <= local_94) {
                uVar10 = local_94;
              }
              uVar17 = local_9c;
              if (uVar1 < uVar10 + 1) {
                if (local_94 < uVar8) {
                  uVar8 = local_94;
                }
                uVar18 = (ulong)uVar8;
                lVar12 = uVar18 * 8;
                pOVar13 = this;
                do {
                  this = local_48;
                  local_9c = (uint)uVar15;
                  uVar16 = uVar16 + 1;
                  local_38 = *(double *)(*(long *)((long)pOVar13->Q + lVar12) + uVar9 * 8);
                  ppdVar4 = pOVar13->S12P;
                  uVar15 = (ulong)local_a0;
                  local_40 = *ppdVar4 + uVar15;
                  local_90 = dVar19;
                  dVar19 = Costs::slopeCost(&cost,(double *)((long)pOVar13->states + lVar12),
                                            pOVar13->states + uVar11,&local_98,&local_a0,
                                            *ppdVar4 + uVar9,local_40,ppdVar4[1] + uVar9,
                                            ppdVar4[1] + uVar15,ppdVar4[2] + uVar9,
                                            ppdVar4[2] + uVar15);
                  dVar20 = dVar19 + local_38 + this->penalty;
                  uVar9 = (ulong)local_98;
                  if (dVar20 < local_90) {
                    uVar17 = local_98;
                  }
                  uVar15 = (ulong)local_9c;
                  dVar19 = local_90;
                  if (dVar20 < local_90) {
                    uVar15 = uVar18 & 0xffffffff;
                    dVar19 = dVar20;
                  }
                  uVar18 = uVar18 + 1;
                  uVar8 = *(uint *)((long)pvVar6 + uVar9 * 4);
                  if (uVar8 <= local_94) {
                    uVar8 = local_94;
                  }
                  lVar12 = lVar12 + 8;
                  pOVar13 = this;
                  uVar11 = local_78;
                } while (uVar18 < uVar8 + 1);
              }
              uVar8 = (uint)uVar15;
              local_98 = local_98 + 1;
              pvVar5 = local_50;
              local_9c = uVar17;
            } while (local_98 < local_a0);
          }
          this->Q[uVar11][local_a0] = dVar19;
          this->lastChpt[uVar11][local_a0] = local_9c;
          this->lastIndState[uVar11][local_a0] = uVar8;
          uVar11 = uVar11 + 1;
          uVar15 = local_80;
        } while (uVar11 != local_80);
      }
      uVar1 = local_a0 + 1;
      uVar8 = local_a0;
      local_a0 = uVar1;
    } while (uVar1 < (uint)local_58);
    dVar19 = (double)uVar16 + (double)uVar16;
  }
  this->pruning =
       dVar19 / ((double)((int)local_68 - 1) *
                (double)(local_68 & 0xffffffff) *
                (double)(uVar15 & 0xffffffff) * (double)(uVar15 & 0xffffffff));
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  return;
}

Assistant:

void OmegaOP::algoChannel(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  //////////////////////////////////////////////////
  /// CHANNEL INFORMATION
  /// u1 / u2 = "min / max" in each column of Q
  unsigned int* u1 = new unsigned int[n + 1];
  unsigned int* u2 = new unsigned int[n + 1];
  unsigned int theStart;
  unsigned int theEnd;
  double theV = 0;
  unsigned int indexTheV = 0;
  unsigned int nbPosition = 0;

  ///
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    /// FILL u1 and u2 vectors in position T-1
    theStart = 0;
    while(theStart < (p - 1) && Q[theStart][T - 1] > Q[theStart + 1][T - 1])
      {theStart = theStart + 1;}
    u1[T-1] = theStart;
    theEnd = p - 1;
    while(theEnd > 0 && Q[theEnd][T - 1] > Q[theEnd - 1][T - 1])
      {theEnd = theEnd - 1;}
    u2[T-1] = theEnd;

    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        ///// FIND the minimum of the cost in start state
        if(t < (T-1))
        {
          theV = cost.vhat(states[v], t, T, S12P[0][t], S12P[0][T], S12P[2][t], S12P[2][T]);
          indexTheV = cost.closestStateIndex(theV, states, p);
        }
        else
        {
          indexTheV = u1[T-1]; // if t = T-1 cost.slopeCost does not depend on u
        }

        /// explore values (in column of states) ONLY between min(u1[t],indexTheV) and max(u2[t],indexTheV)
        for(unsigned int u = std::min(u1[t],indexTheV); u < std::max(u2[t],indexTheV) + 1; u++)
        {
          nbPosition = nbPosition + 1; //we explore +1 position
          temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
          //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
          if(temp_Q > temp_cost)
          {
            temp_Q = temp_cost;
            temp_indState = u;
            temp_chpt = t;
          }
          //std::cout << std::endl;
        }
      }

      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }

  pruning = 2.0*nbPosition/(1.0*p*p*n*(n-1)); //nbPosition seen / nbPosition total

  delete [] u1;
  u1 = NULL;
  delete [] u2;
  u2 = NULL;
}